

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O2

void anon_unknown.dwarf_d68645::cmVariableWatchCommandVariableAccessed
               (string *variable,int access_type,void *client_data,char *newValue,cmMakefile *mf)

{
  bool bVar1;
  string *psVar2;
  char *__s;
  long lVar3;
  initializer_list<cmListFileArgument> __l;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> newLFFArgs;
  undefined1 *local_2f8;
  undefined8 local_2f0;
  undefined1 local_2e8 [16];
  undefined1 *local_2d8;
  undefined8 local_2d0;
  undefined1 local_2c8 [16];
  undefined1 *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8 [16];
  pointer local_298;
  pointer local_290;
  undefined1 local_288 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  undefined1 local_268 [16];
  cmListFileFunction newLFF;
  cmExecutionStatus status;
  string local_158;
  string accessString;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_118;
  cmAlphaNum local_f8;
  string local_c8;
  string stack;
  cmAlphaNum local_88;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  if (*client_data == '\0') {
    *(undefined1 *)client_data = 1;
    psVar2 = cmVariableWatch::GetAccessAsString_abi_cxx11_(access_type);
    std::__cxx11::string::string((string *)&accessString,(string *)psVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&status,"LISTFILE_STACK",(allocator<char> *)&local_88);
    psVar2 = (string *)cmMakefile::GetProperty(mf,(string *)&status);
    if (psVar2 == (string *)0x0) {
      psVar2 = &cmValue::Empty_abi_cxx11_;
    }
    std::__cxx11::string::string((string *)&stack,(string *)psVar2);
    std::__cxx11::string::~string((string *)&status);
    if (*(long *)((long)client_data + 0x10) == 0) {
      status.Makefile = (cmMakefile *)0xa;
      status.Error._M_dataplus._M_p = "Variable \"";
      local_88.View_._M_str = (variable->_M_dataplus)._M_p;
      local_88.View_._M_len = variable->_M_string_length;
      local_158._M_dataplus._M_p = (pointer)(pointer)0x61ebb9;
      if (newValue != (char *)0x0) {
        local_158._M_dataplus._M_p = newValue;
      }
      cmStrCat<char[22],std::__cxx11::string,char[14],char_const*,char[3]>
                ((string *)&local_f8,(cmAlphaNum *)&status,&local_88,
                 (char (*) [22])"\" was accessed using ",&accessString,
                 (char (*) [14])" with value \"",(char **)&local_158,(char (*) [3])0x5b59a8);
      cmMakefile::IssueMessage(mf,LOG,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&status,"CMAKE_CURRENT_LIST_FILE",(allocator<char> *)&local_88);
      psVar2 = (string *)cmMakefile::GetDefinition(mf,(string *)&status);
      std::__cxx11::string::~string((string *)&status);
      std::__cxx11::string::string((string *)(local_288 + 0x10),(string *)variable);
      status.Error._M_dataplus._M_p = (pointer)local_278._8_8_;
      status.Makefile = (cmMakefile *)&status.Error._M_string_length;
      if ((cmMakefile *)local_278._M_allocated_capacity == (cmMakefile *)local_268) {
        status.Error.field_2._M_allocated_capacity = local_268._8_8_;
      }
      else {
        status.Makefile = (cmMakefile *)local_278._M_allocated_capacity;
      }
      local_278._8_8_ = (pointer)0x0;
      local_268[0] = 0;
      status.Error.field_2._8_4_ = 1;
      status.ReturnInvoked = true;
      status.BreakInvoked = true;
      status.ContinueInvoked = true;
      status.NestedError = true;
      status._44_4_ = 0x7fffffff;
      local_278._M_allocated_capacity = (size_type)(cmMakefile *)local_268;
      std::__cxx11::string::string((string *)&local_298,(string *)&accessString);
      status.Variables.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = local_290;
      status.Variables.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&status.Variables.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_298 != (pointer)local_288) {
        status.Variables.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = local_298;
      }
      local_290 = (pointer)0x0;
      local_288[0] = 0;
      __s = "";
      if (newValue != (char *)0x0) {
        __s = newValue;
      }
      local_298 = (pointer)local_288;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,__s,(allocator<char> *)&local_88);
      local_2b8 = local_2a8;
      local_2b0 = 0;
      local_2a8[0] = 0;
      if (psVar2 == (string *)0x0) {
        psVar2 = &cmValue::Empty_abi_cxx11_;
      }
      std::__cxx11::string::string((string *)&local_2d8,(string *)psVar2);
      local_2d8 = local_2c8;
      local_2d0 = 0;
      local_2c8[0] = 0;
      std::__cxx11::string::string((string *)&local_2f8,(string *)&stack);
      local_2f8 = local_2e8;
      local_2f0 = 0;
      local_2e8[0] = 0;
      __l._M_len = 5;
      __l._M_array = (iterator)&status;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
                (&newLFFArgs,__l,(allocator_type *)&local_f8);
      lVar3 = 0xc0;
      do {
        std::__cxx11::string::~string((string *)((long)&status.Makefile + lVar3));
        lVar3 = lVar3 + -0x30;
      } while (lVar3 != -0x30);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)(local_288 + 0x10));
      std::__cxx11::string::string((string *)&local_c8,(string *)((long)client_data + 8));
      local_118.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_start =
           newLFFArgs.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_118.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_finish =
           newLFFArgs.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_118.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           newLFFArgs.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      newLFFArgs.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      newLFFArgs.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      newLFFArgs.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmListFileFunction::cmListFileFunction
                (&newLFF,&local_c8,0x7fffffffffffffff,0x7fffffffffffffff,&local_118);
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_118);
      std::__cxx11::string::~string((string *)&local_c8);
      cmExecutionStatus::cmExecutionStatus(&status,mf);
      local_58._M_engaged = false;
      bVar1 = cmMakefile::ExecuteCommand
                        (mf,&newLFF,&status,
                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_58);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_58);
      if (!bVar1) {
        local_88.View_._M_len = 0x56;
        local_88.View_._M_str =
             "Error in cmake code at\nUnknown:0:\nA command failed during the invocation of callback \""
        ;
        local_f8.View_._M_str = *(char **)((long)client_data + 8);
        local_f8.View_._M_len = *(size_t *)((long)client_data + 0x10);
        cmStrCat<char[3]>(&local_158,&local_88,&local_f8,(char (*) [3])0x5b59a8);
        cmSystemTools::Error(&local_158);
        std::__cxx11::string::~string((string *)&local_158);
      }
      cmExecutionStatus::~cmExecutionStatus(&status);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&newLFF.Impl.
                  super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&newLFFArgs);
    }
    *(undefined1 *)client_data = 0;
    std::__cxx11::string::~string((string *)&stack);
    std::__cxx11::string::~string((string *)&accessString);
  }
  return;
}

Assistant:

void cmVariableWatchCommandVariableAccessed(const std::string& variable,
                                            int access_type, void* client_data,
                                            const char* newValue,
                                            const cmMakefile* mf)
{
  cmVariableWatchCallbackData* data =
    static_cast<cmVariableWatchCallbackData*>(client_data);

  if (data->InCallback) {
    return;
  }
  data->InCallback = true;

  auto accessString = cmVariableWatch::GetAccessAsString(access_type);

  /// Ultra bad!!
  cmMakefile* makefile = const_cast<cmMakefile*>(mf);

  std::string stack = *mf->GetProperty("LISTFILE_STACK");
  if (!data->Command.empty()) {
    cmValue const currentListFile =
      mf->GetDefinition("CMAKE_CURRENT_LIST_FILE");
    const auto fakeLineNo =
      std::numeric_limits<decltype(cmListFileArgument::Line)>::max();

    std::vector<cmListFileArgument> newLFFArgs{
      { variable, cmListFileArgument::Quoted, fakeLineNo },
      { accessString, cmListFileArgument::Quoted, fakeLineNo },
      { newValue ? newValue : "", cmListFileArgument::Quoted, fakeLineNo },
      { *currentListFile, cmListFileArgument::Quoted, fakeLineNo },
      { stack, cmListFileArgument::Quoted, fakeLineNo }
    };

    cmListFileFunction newLFF{ data->Command, fakeLineNo, fakeLineNo,
                               std::move(newLFFArgs) };
    cmExecutionStatus status(*makefile);
    if (!makefile->ExecuteCommand(newLFF, status)) {
      cmSystemTools::Error(
        cmStrCat("Error in cmake code at\nUnknown:0:\nA command failed "
                 "during the invocation of callback \"",
                 data->Command, "\"."));
    }
  } else {
    makefile->IssueMessage(
      MessageType::LOG,
      cmStrCat("Variable \"", variable, "\" was accessed using ", accessString,
               " with value \"", (newValue ? newValue : ""), "\"."));
  }

  data->InCallback = false;
}